

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# se.cpp
# Opt level: O0

void camera_fun(char *ip,int port,int device,int quality)

{
  int __fd;
  reference __buf;
  size_type __n;
  _InputArray local_1c8;
  undefined1 local_1b0 [8];
  Mat frame;
  _InputArray local_150;
  allocator local_131;
  string local_130 [32];
  undefined1 local_110 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  value_type local_e4;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> params;
  Mat capframe;
  VideoCapture local_68 [8];
  VideoCapture capture;
  int nLen;
  int sockClient;
  sockaddr_in addrRec;
  int quality_local;
  int device_local;
  int port_local;
  char *ip_local;
  
  nLen._0_2_ = 2;
  addrRec.sin_zero._0_4_ = quality;
  addrRec.sin_zero._4_4_ = device;
  nLen._2_2_ = htons((uint16_t)port);
  sockClient = inet_addr(ip);
  __fd = socket(2,2,0);
  if (__fd < 0) {
    printf("%d create socket fail\n",(ulong)(uint)port);
    return;
  }
  cv::VideoCapture::VideoCapture(local_68,addrRec.sin_zero._4_4_,0);
  cv::Mat::Mat((Mat *)&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_e0);
  local_e4 = 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_e0,&local_e4);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_e0,(value_type *)addrRec.sin_zero);
  do {
    cv::VideoCapture::operator>>
              (local_68,(Mat *)&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,".jpg",&local_131);
    cv::_InputArray::_InputArray
              (&local_150,
               (Mat *)&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    cv::imencode(local_130,&local_150,(vector *)local_110,(vector *)local_e0);
    cv::_InputArray::~_InputArray(&local_150);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    cv::_InputArray::_InputArray<unsigned_char>
              (&local_1c8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
    cv::imdecode((_InputArray *)local_1b0,(int)&local_1c8);
    cv::_InputArray::~_InputArray(&local_1c8);
    __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,0);
    __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
    sendto(__fd,__buf,__n,0,(sockaddr *)&nLen,0x10);
    cv::waitKey(10);
    cv::Mat::~Mat((Mat *)local_1b0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
  } while( true );
}

Assistant:

void camera_fun(char ip[],int port ,int device,int quality){

	struct sockaddr_in addrRec;

	addrRec.sin_family = AF_INET;
	addrRec.sin_port = htons(port);//
	addrRec.sin_addr.s_addr = inet_addr(ip);//
	
	int sockClient = socket(AF_INET, SOCK_DGRAM, 0);

	if(sockClient < 0){
		printf("%d create socket fail\n",port);
		return ;
	}

	int nLen = sizeof(sockaddr_in);
 
	VideoCapture capture(device);
	Mat capframe;
	
	std::vector<int> params;
	params.push_back(IMWRITE_JPEG_QUALITY);
	params.push_back(quality);

	while (1)
	{
		capture >> capframe;
		std::vector<uchar> buff;
		imencode(".jpg", capframe, buff, params);
	
		Mat frame = imdecode(buff, -1);
		sendto(sockClient, (char *)&buff[0],buff.size() , 0, (struct sockaddr*)&addrRec, nLen);
		waitKey(10);
	}


	close(sockClient);
}